

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_voxel_meshify.h
# Opt level: O3

void ogt_mesh_remove_duplicate_vertices(ogt_voxel_meshify_context *ctx,ogt_mesh *mesh)

{
  char *pcVar1;
  char *pcVar2;
  undefined8 *puVar3;
  char *pcVar4;
  undefined8 *puVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint32_t *puVar9;
  ogt_mesh_vertex *poVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  uint32_t i;
  uint uVar14;
  uint uVar15;
  void *__s;
  void *__s_00;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  size_t sVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  puVar9 = mesh->indices;
  if (((puVar9 != (uint32_t *)0x0) && (uVar6 = mesh->index_count, uVar6 != 0)) &&
     (poVar10 = mesh->vertices, poVar10 != (ogt_mesh_vertex *)0x0)) {
    uVar7 = mesh->vertex_count;
    uVar16 = (ulong)uVar7;
    if (uVar7 != 0) {
      uVar15 = 1;
      do {
        uVar14 = uVar15;
        uVar15 = uVar14 * 2;
      } while (uVar14 < uVar7);
      sVar25 = (ulong)uVar14 << 2;
      if (ctx->alloc_func == (ogt_voxel_meshify_alloc_func)0x0) {
        __s = malloc(sVar25);
      }
      else {
        __s = (*ctx->alloc_func)(sVar25,ctx->alloc_free_user_data);
      }
      memset(__s,0xff,sVar25);
      sVar25 = uVar16 * 4;
      if (ctx->alloc_func == (ogt_voxel_meshify_alloc_func)0x0) {
        __s_00 = malloc(sVar25);
      }
      else {
        __s_00 = (*ctx->alloc_func)(sVar25,ctx->alloc_free_user_data);
      }
      memset(__s_00,0xff,sVar25);
      uVar15 = 0;
      uVar17 = 0;
      uVar7 = 0;
      do {
        uVar18 = (ulong)(uint)((int)uVar17 << 5);
        lVar21 = 0;
        uVar19 = 0;
        do {
          uVar22 = *(int *)((long)&(poVar10->pos).x + lVar21 + (ulong)uVar15) * 0x5bd1e995;
          uVar19 = uVar19 * 0x5bd1e995 ^ (uVar22 >> 0x18 ^ uVar22) * 0x5bd1e995;
          lVar21 = lVar21 + 4;
        } while ((int)lVar21 != 0x20);
        iVar20 = 0;
        uVar22 = uVar14;
        while( true ) {
          uVar19 = uVar19 & uVar14 - 1;
          uVar8 = *(uint *)((long)__s + (ulong)uVar19 * 4);
          uVar23 = (ulong)uVar8;
          if (uVar23 == 0xffffffff) break;
          uVar24 = (ulong)(uVar8 << 5);
          pcVar1 = (char *)((long)&(poVar10->pos).x + uVar18);
          pcVar4 = (char *)((long)&(poVar10->normal).y + uVar18);
          pcVar2 = (char *)((long)&(poVar10->pos).x + uVar24);
          auVar27[0] = -(*pcVar2 == *pcVar1);
          auVar27[1] = -(pcVar2[1] == pcVar1[1]);
          auVar27[2] = -(pcVar2[2] == pcVar1[2]);
          auVar27[3] = -(pcVar2[3] == pcVar1[3]);
          auVar27[4] = -(pcVar2[4] == pcVar1[4]);
          auVar27[5] = -(pcVar2[5] == pcVar1[5]);
          auVar27[6] = -(pcVar2[6] == pcVar1[6]);
          auVar27[7] = -(pcVar2[7] == pcVar1[7]);
          auVar27[8] = -(pcVar2[8] == pcVar1[8]);
          auVar27[9] = -(pcVar2[9] == pcVar1[9]);
          auVar27[10] = -(pcVar2[10] == pcVar1[10]);
          auVar27[0xb] = -(pcVar2[0xb] == pcVar1[0xb]);
          auVar27[0xc] = -(pcVar2[0xc] == pcVar1[0xc]);
          auVar27[0xd] = -(pcVar2[0xd] == pcVar1[0xd]);
          auVar27[0xe] = -(pcVar2[0xe] == pcVar1[0xe]);
          auVar27[0xf] = -(pcVar2[0xf] == pcVar1[0xf]);
          pcVar1 = (char *)((long)&(poVar10->normal).y + uVar24);
          auVar26[0] = -(*pcVar1 == *pcVar4);
          auVar26[1] = -(pcVar1[1] == pcVar4[1]);
          auVar26[2] = -(pcVar1[2] == pcVar4[2]);
          auVar26[3] = -(pcVar1[3] == pcVar4[3]);
          auVar26[4] = -(pcVar1[4] == pcVar4[4]);
          auVar26[5] = -(pcVar1[5] == pcVar4[5]);
          auVar26[6] = -(pcVar1[6] == pcVar4[6]);
          auVar26[7] = -(pcVar1[7] == pcVar4[7]);
          auVar26[8] = -(pcVar1[8] == pcVar4[8]);
          auVar26[9] = -(pcVar1[9] == pcVar4[9]);
          auVar26[10] = -(pcVar1[10] == pcVar4[10]);
          auVar26[0xb] = -(pcVar1[0xb] == pcVar4[0xb]);
          auVar26[0xc] = -(pcVar1[0xc] == pcVar4[0xc]);
          auVar26[0xd] = -(pcVar1[0xd] == pcVar4[0xd]);
          auVar26[0xe] = -(pcVar1[0xe] == pcVar4[0xe]);
          auVar26[0xf] = -(pcVar1[0xf] == pcVar4[0xf]);
          auVar26 = auVar26 & auVar27;
          if ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar26[0xf] >> 7) << 0xf) == 0xffff) {
            if (uVar17 <= uVar23) {
              __assert_fail("*existing_index < vertex_index",
                            "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                            ,0x17f,
                            "uint32_t *hash_table_find_vertex(uint32_t *, uint32_t, const uint8_t *, uint32_t, uint32_t)"
                           );
            }
            uVar19 = *(uint *)((long)__s_00 + uVar23 * 4);
            if (uVar19 == 0xffffffff) {
              __assert_fail("remap_indices[*hash_table_entry] != UINT32_MAX",
                            "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                            ,0x1c2,
                            "void ogt_mesh_remove_duplicate_vertices(const ogt_voxel_meshify_context *, ogt_mesh *)"
                           );
            }
            goto LAB_0010aec9;
          }
          uVar19 = uVar19 + iVar20 + 1;
          iVar20 = iVar20 + 1;
          uVar22 = uVar22 - 1;
          if (uVar22 == 0) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                          ,0x186,
                          "uint32_t *hash_table_find_vertex(uint32_t *, uint32_t, const uint8_t *, uint32_t, uint32_t)"
                         );
          }
        }
        *(int *)((long)__s + (ulong)uVar19 * 4) = (int)uVar17;
        uVar19 = uVar7;
        uVar7 = uVar7 + 1;
LAB_0010aec9:
        *(uint *)((long)__s_00 + uVar17 * 4) = uVar19;
        uVar17 = uVar17 + 1;
        uVar15 = uVar15 + 0x20;
        if (uVar17 == uVar16) {
          uVar15 = 0;
          uVar17 = 0;
          do {
            uVar14 = *(uint *)((long)__s_00 + uVar17 * 4);
            if (uVar17 < uVar14) {
              __assert_fail("dst_index <= src_index",
                            "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                            ,0x1cb,
                            "void ogt_mesh_remove_duplicate_vertices(const ogt_voxel_meshify_context *, ogt_mesh *)"
                           );
            }
            uVar18 = (ulong)(uVar14 << 5);
            puVar3 = (undefined8 *)((long)&(poVar10->pos).x + (ulong)uVar15);
            uVar11 = *puVar3;
            uVar12 = puVar3[1];
            puVar3 = (undefined8 *)((long)&(poVar10->normal).y + (ulong)uVar15);
            uVar13 = puVar3[1];
            puVar5 = (undefined8 *)((long)&(poVar10->normal).y + uVar18);
            *puVar5 = *puVar3;
            puVar5[1] = uVar13;
            puVar3 = (undefined8 *)((long)&(poVar10->pos).x + uVar18);
            *puVar3 = uVar11;
            puVar3[1] = uVar12;
            uVar17 = uVar17 + 1;
            uVar15 = uVar15 + 0x20;
          } while (uVar16 != uVar17);
          uVar16 = 0;
          do {
            puVar9[uVar16] = *(uint32_t *)((long)__s_00 + (ulong)puVar9[uVar16] * 4);
            uVar16 = uVar16 + 1;
          } while (uVar6 != uVar16);
          if (__s != (void *)0x0) {
            if (ctx->free_func == (ogt_voxel_meshify_free_func)0x0) {
              free(__s);
            }
            else {
              (*ctx->free_func)(__s,ctx->alloc_free_user_data);
            }
          }
          if (ctx->free_func == (ogt_voxel_meshify_free_func)0x0) {
            free(__s_00);
          }
          else {
            (*ctx->free_func)(__s_00,ctx->alloc_free_user_data);
          }
          if (uVar7 <= mesh->vertex_count) {
            mesh->vertex_count = uVar7;
            return;
          }
          __assert_fail("num_unique_vertices <= mesh->vertex_count",
                        "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                        ,0x1d6,
                        "void ogt_mesh_remove_duplicate_vertices(const ogt_voxel_meshify_context *, ogt_mesh *)"
                       );
        }
      } while( true );
    }
  }
  __assert_fail("indices && index_count && vertices && vertex_count && vertex_size",
                "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                ,0x1ab,
                "void ogt_mesh_remove_duplicate_vertices(const ogt_voxel_meshify_context *, ogt_mesh *)"
               );
}

Assistant:

void ogt_mesh_remove_duplicate_vertices(const ogt_voxel_meshify_context* ctx, ogt_mesh* mesh) {
    
    uint32_t* indices      = mesh->indices;
    uint32_t  index_count  = mesh->index_count;
    uint8_t*  vertices     = (uint8_t*)mesh->vertices;
    uint32_t  vertex_count = mesh->vertex_count;
    uint32_t  vertex_size  = sizeof(ogt_mesh_vertex);
    assert(indices && index_count && vertices && vertex_count && vertex_size);
    
    // allocate a hash table that is sized at the next power of 2 above the vertex count
    uint32_t hash_table_size = 1;
    while (hash_table_size < vertex_count)
        hash_table_size *= 2;
    uint32_t hash_table_mask = hash_table_size - 1;
    uint32_t* hash_table = (uint32_t*)_voxel_meshify_malloc(ctx, sizeof(uint32_t) * hash_table_size);
    memset(hash_table, -1, hash_table_size * sizeof(uint32_t));

    // generate an remap table for vertex indices
    uint32_t* remap_indices = (uint32_t*)_voxel_meshify_malloc(ctx, sizeof(uint32_t) * vertex_count);
    memset(remap_indices, -1, vertex_count * sizeof(uint32_t));
    uint32_t num_unique_vertices = 0;
    for (uint32_t vertex_index = 0; vertex_index < vertex_count; vertex_index++) {
        uint32_t* hash_table_entry = hash_table_find_vertex(hash_table, hash_table_mask, vertices, vertex_size, vertex_index);
        if (*hash_table_entry == UINT32_MAX) {
            // vertex is not already in the hash table. allocate a unique index for it.
            *hash_table_entry = vertex_index;;
            remap_indices[vertex_index] = num_unique_vertices++;
        }
        else {
            // vertex is already in the hash table. Point this to the index that is already existing!
            assert(remap_indices[*hash_table_entry] != UINT32_MAX);
            remap_indices[vertex_index] = remap_indices[*hash_table_entry];
        }
    }

    // compact all vertices using the remap_indices map.
    for (uint32_t i = 0; i < vertex_count; i++) {
        uint32_t dst_index = remap_indices[i];
        uint32_t src_index = i;
        assert(dst_index <= src_index);
        memcpy(&vertices[dst_index*vertex_size], &vertices[src_index*vertex_size], vertex_size);
    }
    // remap all indices now
    for (uint32_t i = 0; i < index_count; i++) {
        indices[i] = remap_indices[indices[i]];
    }

    _voxel_meshify_free(ctx, hash_table);
    _voxel_meshify_free(ctx, remap_indices);

    assert(num_unique_vertices <= mesh->vertex_count);
    mesh->vertex_count = num_unique_vertices;
}